

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_base_ident(lys_module *module,lys_ident *ident,char *basename,char *parent,
                      lys_type *type,unres_schema *unres)

{
  uint *puVar1;
  byte bVar2;
  ly_ctx *plVar3;
  long lVar4;
  lys_ident *der;
  char **ppcVar5;
  int iVar6;
  lys_type_bit *plVar7;
  lys_tpdf *plVar8;
  char *pcVar9;
  lys_module *plVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  lys_ident *plVar16;
  char *local_90;
  lys_ident *target;
  char *local_80;
  ly_ctx *local_78;
  lys_ident *local_70;
  lys_type *local_68;
  char *local_60;
  ly_ctx *local_58;
  lys_module *local_50;
  char **local_48;
  lys_module *local_40;
  uint16_t local_32;
  
  if ((ident == (lys_ident *)0x0) != (type != (lys_type *)0x0)) {
    __assert_fail("(ident && !type) || (!ident && type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x166c,
                  "int resolve_base_ident(const struct lys_module *, struct lys_ident *, const char *, const char *, struct lys_type *, struct unres_schema *)"
                 );
  }
  plVar3 = module->ctx;
  target = (lys_ident *)unres;
  local_40 = module;
  if (type == (lys_type *)0x0) {
    local_48 = &local_90;
    plVar8 = (lys_tpdf *)ident;
  }
  else {
    uVar14 = (type->info).bits.count + 1;
    (type->info).bits.count = uVar14;
    plVar7 = (lys_type_bit *)ly_realloc((type->info).bits.bit,(ulong)uVar14 << 3);
    (type->info).bits.bit = plVar7;
    if (plVar7 == (lys_type_bit *)0x0) {
      ly_log(plVar3,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_base_ident");
      return -1;
    }
    local_48 = &plVar7->name + ((type->info).bits.count - 1);
    plVar8 = type->parent;
  }
  local_50 = plVar8->module;
  local_32 = plVar8->flags;
  local_70 = ident;
  local_68 = type;
  local_60 = parent;
  *local_48 = (char *)0x0;
  pcVar9 = strchr(basename,0x3a);
  local_58 = plVar3;
  if (pcVar9 == (char *)0x0) {
    iVar12 = 0;
    pcVar11 = (char *)0x0;
    pcVar9 = basename;
  }
  else {
    iVar12 = (int)pcVar9 - (int)basename;
    pcVar9 = pcVar9 + 1;
    pcVar11 = local_40->name;
    iVar6 = strncmp(basename,pcVar11,(long)iVar12);
    if ((iVar6 == 0) && (pcVar11[iVar12] == '\0')) {
      iVar12 = 0;
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar11 = (char *)0x0;
      if (iVar12 != 0) {
        pcVar11 = basename;
      }
    }
  }
  plVar3 = local_58;
  plVar10 = lyp_get_module(local_40,(char *)0x0,0,pcVar11,iVar12,0);
  if (plVar10 == (lys_module *)0x0) {
    ly_vlog(plVar3,LYE_INMOD,LY_VLOG_NONE,(void *)0x0,basename);
    return -1;
  }
  local_78 = plVar10->ctx;
  uVar15 = (ulong)plVar10->ident_size;
  local_80 = basename;
  if (uVar15 != 0) {
    plVar16 = plVar10->ident;
    do {
      iVar12 = strcmp(pcVar9,plVar16->name);
      if (iVar12 == 0) goto LAB_0011d260;
      plVar16 = plVar16 + 1;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  bVar2 = plVar10->inc_size;
  if ((ulong)bVar2 != 0) {
    local_40 = (lys_module *)plVar10->inc;
    uVar15 = 0;
    do {
      lVar4 = *(long *)(local_40->padding2 + uVar15 * 0x30 + -0x42);
      if (lVar4 == 0) break;
      uVar13 = (ulong)*(ushort *)(lVar4 + 0x48);
      if (uVar13 != 0) {
        plVar16 = *(lys_ident **)(lVar4 + 0x78);
        do {
          iVar12 = strcmp(pcVar9,plVar16->name);
          if (iVar12 == 0) goto LAB_0011d260;
          plVar16 = plVar16 + 1;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != bVar2);
  }
LAB_0011d3b2:
  ly_vlog(local_58,LYE_INRESOLV,LY_VLOG_NONE,(void *)0x0,local_60,local_80);
  if (local_68 != (lys_type *)0x0) {
    puVar1 = &(local_68->info).bits.count;
    *puVar1 = *puVar1 - 1;
    return 1;
  }
  return 1;
LAB_0011d260:
  ppcVar5 = local_48;
  plVar10 = local_50;
  der = local_70;
  plVar3 = local_78;
  if (local_70 == (lys_ident *)0x0) {
    *local_48 = (char *)plVar16;
    pcVar9 = "of type";
    plVar10 = local_50;
  }
  else {
    if ((ulong)*(uint *)&target->ext == 0) {
      *local_48 = (char *)plVar16;
      plVar10 = local_50;
    }
    else {
      uVar15 = 0;
      do {
        if ((*(lys_ident **)(target->name + uVar15 * 8) == plVar16) &&
           (*(int *)(target->dsc + uVar15 * 4) == 0x100)) {
          if (*(char **)(target->ref + uVar15 * 8) == local_70->name) {
            ly_vlog(local_78,LYE_INARG,LY_VLOG_NONE,(void *)0x0,pcVar9,"base");
            ly_vlog(plVar3,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                    "Circular reference of \"%s\" identity.",pcVar9);
            return -1;
          }
          goto LAB_0011d3b2;
        }
        uVar15 = uVar15 + 1;
      } while (*(uint *)&target->ext != uVar15);
      *local_48 = (char *)plVar16;
      if (der == (lys_ident *)0x0) {
        pcVar9 = "of type";
        goto LAB_0011d32b;
      }
    }
    pcVar9 = der->name;
  }
LAB_0011d32b:
  iVar12 = lyp_check_status(local_32,plVar10,pcVar9,plVar16->flags,plVar16->module,plVar16->name,
                            (lys_node *)0x0);
  if (der == (lys_ident *)0x0) {
    return -(uint)(iVar12 != 0);
  }
  if (iVar12 == 0) {
    plVar16 = (lys_ident *)*ppcVar5;
    bVar2 = der->base_size;
    der->base_size = bVar2 + 1;
    der->base[bVar2] = plVar16;
    plVar10 = lys_main_module(plVar10);
    if ((plVar10->field_0x40 & 0x80) != 0) {
      resolve_identity_backlink_update(der,(lys_ident *)*ppcVar5);
      return 0;
    }
    return 0;
  }
  return -(uint)(iVar12 != 0);
}

Assistant:

static int
resolve_base_ident(const struct lys_module *module, struct lys_ident *ident, const char *basename, const char *parent,
                   struct lys_type *type, struct unres_schema *unres)
{
    const char *name;
    int mod_name_len = 0, rc;
    struct lys_ident *target, **ret;
    uint16_t flags;
    struct lys_module *mod;
    struct ly_ctx *ctx = module->ctx;

    assert((ident && !type) || (!ident && type));

    if (!type) {
        /* have ident to resolve */
        ret = &target;
        flags = ident->flags;
        mod = ident->module;
    } else {
        /* have type to fill */
        ++type->info.ident.count;
        type->info.ident.ref = ly_realloc(type->info.ident.ref, type->info.ident.count * sizeof *type->info.ident.ref);
        LY_CHECK_ERR_RETURN(!type->info.ident.ref, LOGMEM(ctx), -1);

        ret = &type->info.ident.ref[type->info.ident.count - 1];
        flags = type->parent->flags;
        mod = type->parent->module;
    }
    *ret = NULL;

    /* search for the base identity */
    name = strchr(basename, ':');
    if (name) {
        /* set name to correct position after colon */
        mod_name_len = name - basename;
        name++;

        if (!strncmp(basename, module->name, mod_name_len) && !module->name[mod_name_len]) {
            /* prefix refers to the current module, ignore it */
            mod_name_len = 0;
        }
    } else {
        name = basename;
    }

    /* get module where to search */
    module = lyp_get_module(module, NULL, 0, mod_name_len ? basename : NULL, mod_name_len, 0);
    if (!module) {
        /* identity refers unknown data model */
        LOGVAL(ctx, LYE_INMOD, LY_VLOG_NONE, NULL, basename);
        return -1;
    }

    /* search in the identified module ... */
    rc = resolve_base_ident_sub(module, ident, name, unres, ret);
    if (!rc) {
        assert(*ret);

        /* check status */
        if (lyp_check_status(flags, mod, ident ? ident->name : "of type",
                             (*ret)->flags, (*ret)->module, (*ret)->name, NULL)) {
            rc = -1;
        } else if (ident) {
            ident->base[ident->base_size++] = *ret;
            if (lys_main_module(mod)->implemented) {
                /* in case of the implemented identity, maintain backlinks to it
                 * from the base identities to make it available when resolving
                 * data with the identity values (not implemented identity is not
                 * allowed as an identityref value). */
                resolve_identity_backlink_update(ident, *ret);
            }
        }
    } else if (rc == EXIT_FAILURE) {
        LOGVAL(ctx, LYE_INRESOLV, LY_VLOG_NONE, NULL, parent, basename);
        if (type) {
            --type->info.ident.count;
        }
    }

    return rc;
}